

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRunner.h
# Opt level: O0

void __thiscall
aeron::concurrent::AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy>::
AgentRunner(AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy> *this,
           ClientConductor *agent,SleepingIdleStrategy *idleStrategy,
           exception_handler_t *exceptionHandler,string *name)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  atomic<bool> *in_RDI;
  string *in_R8;
  undefined8 in_stack_ffffffffffffffb8;
  
  *(undefined8 *)in_RDI = in_RSI;
  *(undefined8 *)(in_RDI + 8) = in_RDX;
  *(undefined8 *)(in_RDI + 0x10) = in_RCX;
  std::atomic<bool>::atomic(in_RDI,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
  std::thread::thread((thread *)0x1ea5a1);
  std::__cxx11::string::string((string *)(in_RDI + 0x28),in_R8);
  return;
}

Assistant:

AgentRunner(
        Agent& agent, IdleStrategy& idleStrategy, logbuffer::exception_handler_t& exceptionHandler, const std::string& name) :
        m_agent(agent),
        m_idleStrategy(idleStrategy),
        m_exceptionHandler(exceptionHandler),
        m_running(true),
        m_name(name)
    {
    }